

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_plus.c
# Opt level: O1

MPP_RET hal_avsd_plus_reset(void *decoder)

{
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","In.","hal_avsd_plus_reset");
  }
  *(undefined8 *)((long)decoder + 0x1fc) = 1;
  *(undefined8 *)((long)decoder + 0x1c0) = 0;
  *(undefined8 *)((long)decoder + 0x1c8) = 0;
  *(undefined8 *)((long)decoder + 0x1d0) = 0;
  *(undefined8 *)((long)decoder + 0x1d8) = 0;
  *(undefined8 *)((long)decoder + 0x1e0) = 0;
  *(undefined8 *)((long)decoder + 0x1e8) = 0;
  *(undefined8 *)((long)decoder + 0x1ec) = 0;
  *(undefined8 *)((long)decoder + 500) = 0;
  *(undefined4 *)((long)decoder + 0x214) = 0xffffffff;
  *(undefined8 *)((long)decoder + 0x20c) = 0xffffffffffffffff;
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","Out.","hal_avsd_plus_reset");
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_avsd_plus_reset(void *decoder)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");

    p_hal->first_field = 1;
    p_hal->prev_pic_structure = 0; //!< field

    memset(p_hal->pic, 0, sizeof(p_hal->pic));
    p_hal->work_out = -1;
    p_hal->work0 = -1;
    p_hal->work1 = -1;

    AVSD_HAL_TRACE("Out.");

    return ret = MPP_OK;
}